

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

void relmon(monst *mon)

{
  bool bVar1;
  monst *local_18;
  monst *mtmp;
  monst *mon_local;
  
  if (mon->dlevel->monlist == (monst *)0x0) {
    panic("relmon: no level->monlist available.");
  }
  mon->dlevel->monsters[mon->mx][mon->my] = (monst *)0x0;
  if (mon == mon->dlevel->monlist) {
    mon->dlevel->monlist = mon->dlevel->monlist->nmon;
  }
  else {
    local_18 = mon->dlevel->monlist;
    while( true ) {
      bVar1 = false;
      if (local_18 != (monst *)0x0) {
        bVar1 = local_18->nmon != mon;
      }
      if (!bVar1) break;
      local_18 = local_18->nmon;
    }
    if (local_18 == (monst *)0x0) {
      panic("relmon: mon not in list.");
    }
    local_18->nmon = mon->nmon;
  }
  return;
}

Assistant:

void relmon(struct monst *mon)
{
	struct monst *mtmp;

	if (mon->dlevel->monlist == NULL)  panic ("relmon: no level->monlist available.");

	mon->dlevel->monsters[mon->mx][mon->my] = NULL;

	if (mon == mon->dlevel->monlist)
	    mon->dlevel->monlist = mon->dlevel->monlist->nmon;
	else {
		for (mtmp = mon->dlevel->monlist; mtmp && mtmp->nmon != mon; mtmp = mtmp->nmon)
		    ;
		if (mtmp)    mtmp->nmon = mon->nmon;
		else	    panic("relmon: mon not in list.");
	}
}